

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

DescriptorFlags __thiscall
Js::JavascriptProxy::GetSetter
          (JavascriptProxy *this,JavascriptString *propertyNameString,Var *setterValueOrProxy,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  *setterValueOrProxy = this;
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = (RecyclableObject *)this;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
    *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
  }
  return Proxy;
}

Assistant:

DescriptorFlags JavascriptProxy::GetSetter(JavascriptString* propertyNameString, Var* setterValueOrProxy, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        *setterValueOrProxy = this;
        PropertyValueInfo::SetNoCache(info, this);
        PropertyValueInfo::DisablePrototypeCache(info, this); // We can't cache prototype property either
        return DescriptorFlags::Proxy;
    }